

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_parser.cpp
# Opt level: O2

Configuration ParseCmdArgs(int argc,char **argv,int *argc_flags_offset_out)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar4;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  int iVar5;
  uint uVar6;
  allocator<char> local_65;
  uint local_64;
  uint local_60;
  uint local_5c;
  int *local_58;
  string flag;
  
  iVar5 = 1;
  local_64 = 0;
  local_60 = 0;
  local_5c = 0;
  uVar6 = 0;
  local_58 = argc_flags_offset_out;
  do {
    if (argc <= iVar5) break;
    std::__cxx11::string::string<std::allocator<char>>((string *)&flag,argv[iVar5],&local_65);
    bVar3 = std::operator==(&flag,"--help");
    if ((bVar3) || (bVar3 = std::operator==(&flag,"-h"), bVar3)) {
      uVar6 = 1;
LAB_001048c0:
      iVar5 = iVar5 + 1;
      bVar3 = true;
    }
    else {
      bVar3 = std::operator==(&flag,"--silent");
      uVar4 = extraout_var;
      if ((bVar3) || (bVar3 = std::operator==(&flag,"-s"), uVar4 = extraout_var_00, bVar3)) {
        local_5c = (uint)CONCAT71(uVar4,1);
        goto LAB_001048c0;
      }
      bVar3 = std::operator==(&flag,"--perf");
      uVar4 = extraout_var_01;
      if ((bVar3) || (bVar3 = std::operator==(&flag,"-p"), uVar4 = extraout_var_02, bVar3)) {
        local_60 = (uint)CONCAT71(uVar4,1);
        goto LAB_001048c0;
      }
      bVar3 = std::operator==(&flag,"--interactive");
      uVar4 = extraout_var_03;
      if ((bVar3) || (bVar3 = std::operator==(&flag,"-i"), uVar4 = extraout_var_04, bVar3)) {
        local_64 = (uint)CONCAT71(uVar4,1);
        goto LAB_001048c0;
      }
      bVar3 = false;
    }
    std::__cxx11::string::~string((string *)&flag);
  } while (bVar3);
  uVar1 = local_64;
  if (((iVar5 == argc) && (uVar2 = 1, (local_64 & 1) == 0)) || (uVar2 = uVar6, uVar6 != 0)) {
    uVar6 = uVar2;
    PrintUsage();
  }
  *local_58 = iVar5;
  return (Configuration)(uVar6 | (local_5c & 0xff) << 8 | (local_60 & 0xff) << 0x10 | uVar1 << 0x18)
  ;
}

Assistant:

Configuration ParseCmdArgs(int argc, char **argv, int &argc_flags_offset_out) {
    //executable name should be skipped
    int offset = 1;
    
    Configuration config;
    
    while (offset < argc) {
        std::string flag(argv[offset]);
        if (flag == "--help" || flag == "-h") {
            config.printUsage = true;
            ++offset;
            continue;
        }
        if (flag == "--silent" || flag == "-s") {
            config.silent = true;
            ++offset;
            continue;
        }
        if (flag == "--perf" || flag == "-p") {
            config.measurePerformance = true;
            ++offset;
            continue;
        }
        if (flag == "--interactive" || flag == "-i") {
            config.interactive = true;
            ++offset;
            continue;
        }
        break;
    }
    //usage should be printed when we don't know what to process
    if (argc == offset && !config.interactive) {
        config.printUsage = true;
    }
    if (config.printUsage) PrintUsage();
    
    argc_flags_offset_out = offset;
    return config;
}